

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O0

void __thiscall QUndoView::setGroup(QUndoView *this,QUndoGroup *group)

{
  bool bVar1;
  QUndoViewPrivate *pQVar2;
  QUndoGroup *pQVar3;
  long in_FS_OFFSET;
  QUndoViewPrivate *d;
  QUndoStack *in_stack_ffffffffffffffb8;
  QUndoModel *in_stack_ffffffffffffffc0;
  QUndoModel *this_00;
  Connection local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QUndoView *)0xa98a7a);
  bVar1 = ::operator==((QPointer<QUndoGroup> *)in_stack_ffffffffffffffc0,
                       (QUndoGroup **)in_stack_ffffffffffffffb8);
  if (!bVar1) {
    local_18 = 0;
    bVar1 = ::operator!=((QPointer<QUndoGroup> *)in_stack_ffffffffffffffc0,
                         (nullptr_t *)in_stack_ffffffffffffffb8);
    if (bVar1) {
      pQVar3 = ::QPointer::operator_cast_to_QUndoGroup_((QPointer<QUndoGroup> *)0xa98ad6);
      QObject::disconnect((QObject *)pQVar3,"2activeStackChanged(QUndoStack*)",
                          (QObject *)pQVar2->model,"1setStack(QUndoStack*)");
    }
    QPointer<QUndoGroup>::operator=
              ((QPointer<QUndoGroup> *)in_stack_ffffffffffffffc0,
               (QUndoGroup *)in_stack_ffffffffffffffb8);
    local_20 = 0;
    bVar1 = ::operator!=((QPointer<QUndoGroup> *)in_stack_ffffffffffffffc0,
                         (nullptr_t *)in_stack_ffffffffffffffb8);
    if (bVar1) {
      pQVar3 = ::QPointer::operator_cast_to_QUndoGroup_((QPointer<QUndoGroup> *)0xa98b44);
      QObject::connect((QObject *)&local_28,(char *)pQVar3,
                       (QObject *)"2activeStackChanged(QUndoStack*)",(char *)pQVar2->model,0xb4d247)
      ;
      QMetaObject::Connection::~Connection(&local_28);
      this_00 = pQVar2->model;
      QPointer<QUndoGroup>::operator->((QPointer<QUndoGroup> *)0xa98b9a);
      QUndoGroup::activeStack();
      QUndoModel::setStack(this_00,in_stack_ffffffffffffffb8);
    }
    else {
      QUndoModel::setStack(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoView::setGroup(QUndoGroup *group)
{
    Q_D(QUndoView);

    if (d->group == group)
        return;

    if (d->group != nullptr) {
        disconnect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
    }

    d->group = group;

    if (d->group != nullptr) {
        connect(d->group, SIGNAL(activeStackChanged(QUndoStack*)),
                d->model, SLOT(setStack(QUndoStack*)));
        d->model->setStack(d->group->activeStack());
    } else {
        d->model->setStack(nullptr);
    }
}